

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_pow(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  short sVar1;
  char *src;
  err_frame_t *peVar2;
  CVmException *pCVar3;
  int iVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  char *ext1;
  char *ext2;
  char *val2_ext;
  uint hdl2;
  uint hdl1;
  char *new_ext;
  vm_val_t val2;
  err_frame_t err_cur__;
  
  iVar4 = setup_getp_1(this,self,retval,argc,&new_ext,&val2,&val2_ext,0);
  if (iVar4 == 0) {
    if (((this->super_CVmObject).ext_[4] & 8U) == 0) {
      alloc_temp_regs((ulong)*(ushort *)new_ext + 3,2,&ext1,&hdl1,&ext2,&hdl2);
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      err_cur__.prv_ = (err_frame_t *)*puVar5;
      plVar6 = (long *)_ZTW11G_err_frame();
      *plVar6 = (long)&err_cur__;
      err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
      if (err_cur__.state_ == 0) {
        src = (this->super_CVmObject).ext_;
        if ((src[4] & 1U) != 0) {
          copy_val(ext2,src,0);
          ext2[4] = ext2[4] & 0xfe;
          sVar1 = *(short *)(val2_ext + 2);
          uVar7 = (ulong)(uint)(int)sVar1;
          uVar10 = 0;
          if (-1 < sVar1) {
            uVar10 = uVar7;
          }
          iVar4 = (int)uVar10 * 4;
          do {
            if (*(ushort *)val2_ext <= uVar10) {
              if (*(ushort *)val2_ext < uVar7 || sVar1 < 1) {
                compute_ln_into(ext1,ext2);
                goto LAB_0022b641;
              }
              bVar8 = val2_ext[(uVar7 - 1 >> 1) + 5];
              compute_ln_into(ext1,ext2);
              compute_prod_into(ext2,val2_ext,ext1);
              compute_exp_into(ext1,ext2);
              if ((bVar8 >> (~(byte)((int)(uVar7 - 1) << 2) & 4) & 1) != 0) {
                if ((ext1[4] & 8U) == 0) {
                  ext1[4] = ext1[4] ^ 1;
                }
              }
              goto LAB_0022b654;
            }
            uVar9 = uVar10 >> 1;
            bVar8 = (byte)iVar4;
            uVar10 = uVar10 + 1;
            iVar4 = iVar4 + 4;
          } while (((byte)val2_ext[uVar9 + 5] >> (~bVar8 & 4) & 0xf) == 0);
          goto LAB_0022b609;
        }
        compute_ln_into(ext1,src);
LAB_0022b641:
        compute_prod_into(ext2,val2_ext,ext1);
        compute_exp_into(ext1,ext2);
LAB_0022b654:
        copy_val(new_ext,ext1,1);
      }
      if (-1 < (short)err_cur__.state_) {
        err_cur__.state_ = err_cur__.state_ | 0x8000;
        release_temp_regs(2,(ulong)hdl1,(ulong)hdl2);
      }
      peVar2 = err_cur__.prv_;
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      *puVar5 = peVar2;
      if ((err_cur__.state_ & 0x4001U) != 0) {
        puVar5 = (undefined8 *)_ZTW11G_err_frame();
        if ((*(byte *)*puVar5 & 2) != 0) {
          plVar6 = (long *)_ZTW11G_err_frame();
          free(*(void **)(*plVar6 + 0x10));
        }
        pCVar3 = err_cur__.exc_;
        plVar6 = (long *)_ZTW11G_err_frame();
        *(CVmException **)(*plVar6 + 0x10) = pCVar3;
        err_rethrow();
      }
      if ((err_cur__.state_ & 2U) != 0) {
        free(err_cur__.exc_);
      }
    }
    else {
      if ((val2_ext[4] & 8U) != 0) {
LAB_0022b609:
        err_throw(0x7eb);
      }
      if ((val2_ext[4] & 1U) != 0) {
        err_throw(0x7d8);
      }
      set_zero(new_ext);
    }
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_pow(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    const char *val2_ext;
    char *new_ext;
    size_t prec;
    uint hdl1, hdl2;
    char *ext1, *ext2;

    /* check arguments and allocate the result value */
    if (setup_getp_1(vmg_ self, retval, argc, &new_ext,
                     &val2, &val2_ext, FALSE))
        return TRUE;

    /* use the precision of the result */
    prec = get_prec(new_ext);
    
    /* 
     *   Check for a special case: if the number we're exponentiating is
     *   zero, the result is 0 for any positive exponent, and an error for
     *   any non-positive exponent (0^0 is undefined, and 0^n where n<0 is
     *   equivalent to 1/0^n == 1/0, which is a divide-by-zero error).  
     */
    if (is_zero(ext_))
    {
        /* 0^0 is undefined */
        if (is_zero(val2_ext))
            err_throw(VMERR_OUT_OF_RANGE);

        /* 0^negative is a divide by zero error */
        if (get_neg(val2_ext))
            err_throw(VMERR_DIVIDE_BY_ZERO);
        
        /* set the result to one, and we're done */
        set_zero(new_ext);
        goto done;
    }

    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 2,
                    &ext1, &hdl1, &ext2, &hdl2);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        int result_neg;
        
        /*
         *   If a = e^b, then b = ln(a).  This means that x^y = e^ln(x^y)
         *   = e^(y * ln(x)).  So, we can compute the result in terms of
         *   natural logarithm and exponentiation of 'e', for which we
         *   have primitives we can call.  
         */

        /*
         *   If x is negative, we can only exponentiate the value to
         *   integer powers.  In this case, we can substitute x' = -x
         *   (hence x' will be positive), and rewrite the expression as
         *   
         *   (-1)^y * (x')^y
         *   
         *   We can only calculate (-1)^y for integer values of y, since
         *   the result is complex if y is not an integer.  
         */
        if (get_neg(ext_))
        {
            size_t idx;
            int units_dig;
            
            /* copy x into r2 */
            copy_val(ext2, ext_, FALSE);

            /* 
             *   calculate x' = (-x) - since x is negative, this will
             *   guarantee that x' is positive 
             */
            set_neg(ext2, FALSE);

            /* 
             *   make sure y is an integer - start at the first digit
             *   after the decimal point and check for any non-zero digits 
             */
            idx = (get_exp(val2_ext) < 0 ? 0 : (size_t)get_exp(val2_ext));
            for ( ; idx < get_prec(val2_ext) ; ++idx)
            {
                /* if this digit isn't a zero, it's not an integer */
                if (get_dig(val2_ext, idx) != 0)
                {
                    /* y isn't an integer, so we can't calculate (-1)^y */
                    err_throw(VMERR_OUT_OF_RANGE);
                }
            }

            /* get the first digit to the left of the decimal point */
            if (get_exp(val2_ext) <= 0
                || (size_t)get_exp(val2_ext) > get_prec(val2_ext))
            {
                /* the units digit isn't represented - zero is implied */
                units_dig = 0;
            }
            else
            {
                /* get the digit */
                units_dig = get_dig(val2_ext, (size_t)get_exp(val2_ext) - 1);
            }

            /* 
             *   if the units digit is even, the result will be positive;
             *   if it's odd, the result will be negative 
             */
            result_neg = ((units_dig & 1) != 0);

            /* calculate ln(x') into r1 */
            compute_ln_into(ext1, ext2);
        }
        else
        {
            /* calculate ln(x) into r1 */
            compute_ln_into(ext1, ext_);

            /* the result will be positive */
            result_neg = FALSE;
        }

        /* calculate y * ln(x) into r2 */
        compute_prod_into(ext2, val2_ext, ext1);

        /* calculate exp(r2) = exp(y*ln(x)) = x^y into r1 */
        compute_exp_into(ext1, ext2);

        /* negate the result if we had a negative x and an odd power */
        if (result_neg)
            negate(ext1);

        /* save the result, rounding as needed */
        copy_val(new_ext, ext1, TRUE);
    }